

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamMultiReaderPrivate::CloseFile(BamMultiReaderPrivate *this,string *filename)

{
  bool bVar1;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string currentError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  
  (this->m_errorString)._M_string_length = 0;
  *(this->m_errorString)._M_dataplus._M_p = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&filenames,1,filename,(allocator_type *)&currentError);
  bVar1 = CloseFiles(this,&filenames);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&currentError,(string *)&this->m_errorString);
    std::__cxx11::string::string((string *)&local_70,"error while closing file: ",&local_d1);
    std::operator+(&local_b0,&local_70,filename);
    std::operator+(&local_d0,&local_b0,'\n');
    std::operator+(&message,&local_d0,&currentError);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string
              ((string *)&local_d0,"BamMultiReader::CloseFile",(allocator *)&local_b0);
    SetErrorString(this,&local_d0,&message);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&currentError);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filenames);
  return bVar1;
}

Assistant:

bool BamMultiReaderPrivate::CloseFile(const std::string& filename)
{

    m_errorString.clear();

    std::vector<std::string> filenames(1, filename);
    if (CloseFiles(filenames)) {
        return true;
    } else {
        const std::string currentError = m_errorString;
        const std::string message =
            std::string("error while closing file: ") + filename + '\n' + currentError;
        SetErrorString("BamMultiReader::CloseFile", message);
        return false;
    }
}